

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_queue.h
# Opt level: O1

int __thiscall myutils::ShmemQueue::poll(ShmemQueue *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  int iVar6;
  bool bVar7;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  iVar6 = 0;
  while( true ) {
    LOCK();
    bVar7 = (this->m_rw_mtx).super___atomic_base<int>._M_i == 0;
    if (bVar7) {
      (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
    }
    UNLOCK();
    if (bVar7) {
      iVar1 = this->m_read_pos;
      if (this->m_read_pos < this->m_write_pos) {
        iVar2 = *(int *)(this->m_data + iVar1);
        *__fds = (pollfd)((long)this[1].m_data + (long)iVar1 + -0x14);
        *(long *)__nfds = (long)iVar2;
        iVar6 = 1;
        if (this->m_write_pos - this->m_read_pos < iVar2 + 4) {
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
          poVar5 = std::operator<<(poVar5,",");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_write_pos);
          poVar5 = std::operator<<(poVar5,",");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_read_pos);
          std::endl<char,std::char_traits<char>>(poVar5);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                        ,0x69,"bool myutils::ShmemQueue::poll(const char **, size_t *)");
        }
      }
      else if (this->m_write_pos < iVar1) {
        iVar1 = *(int *)(this->m_data + this->m_read_pos);
        *__fds = (pollfd)((long)this[1].m_data + (long)this->m_read_pos + -0x14);
        *(long *)__nfds = (long)iVar1;
        iVar6 = 1;
        if (this->m_data_size - this->m_read_pos < iVar1 + 4) {
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(long)iVar1);
          poVar5 = std::operator<<(poVar5,",");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_data_realsize);
          poVar5 = std::operator<<(poVar5,",");
          std::ostream::operator<<(poVar5,this->m_read_pos);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                        ,0x75,"bool myutils::ShmemQueue::poll(const char **, size_t *)");
        }
      }
      LOCK();
      (this->m_rw_mtx).super___atomic_base<int>._M_i =
           (this->m_rw_mtx).super___atomic_base<int>._M_i + -1;
      UNLOCK();
    }
    if (bVar7) break;
    lVar4 = std::chrono::_V2::system_clock::now();
    if (9999999 < lVar4 - lVar3) {
      return 0;
    }
  }
  return iVar6;
}

Assistant:

bool ShmemQueue::poll(const char** data, size_t* size)
    {
        bool ret = false;
        auto begin_time = system_clock::now();
        do {
            int32_t v = 0;
            if (m_rw_mtx.compare_exchange_strong(v, 1)) {
                if (m_read_pos < m_write_pos) {
                    char* p = m_data + m_read_pos;
                    int32_t pkt_size = *(int32_t*)p;
                    *data = p + 4;
                    *size = pkt_size;
                    //assert(pkt_size + 4 <= m_write_pos - m_read_pos);
                    if (pkt_size + 4 > m_write_pos - m_read_pos) {
                        cout << pkt_size << "," << m_write_pos << "," << m_read_pos << endl;
                        assert(0);
                    }
                    ret = true;
                }
                else if (m_read_pos > m_write_pos) {
                    char* p = m_data + m_read_pos;
                    int32_t pkt_size = *(int32_t*)p;
                    *data = p + 4;
                    *size = pkt_size;
                    //assert( pkt_size + 4 <= m_data_size - m_read_pos);
                    if ( pkt_size + 4 > m_data_size - m_read_pos) {
                        cout << *size << "," << m_data_realsize << "," << m_read_pos;
                        assert(false);
                    }
                    ret = true;
                }
                m_rw_mtx--;
                return ret;
            }

        } while (system_clock::now() - begin_time < milliseconds(10));

        return false;
    }